

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecore.cpp
# Opt level: O1

void __thiscall CCharacterCore::AddDragVelocity(CCharacterCore *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar3 = (float)(this->m_pWorld->m_Tuning).m_HookDragSpeed.m_Value / 100.0;
  fVar4 = -fVar3;
  fVar1 = (this->m_Vel).field_0.x;
  fVar2 = (this->m_HookDragVel).field_0.x;
  fVar5 = fVar1;
  if (0.0 <= fVar2) {
    if ((fVar1 <= fVar3) && (fVar5 = fVar3, fVar1 + fVar2 <= fVar3)) {
      fVar5 = fVar1 + fVar2;
    }
  }
  else if ((fVar4 <= fVar1) && (fVar5 = fVar4, fVar4 <= fVar1 + fVar2)) {
    fVar5 = fVar1 + fVar2;
  }
  (this->m_Vel).field_0.x = fVar5;
  fVar1 = (this->m_Vel).field_1.y;
  fVar2 = (this->m_HookDragVel).field_1.y;
  fVar5 = fVar1;
  if (0.0 <= fVar2) {
    if ((fVar1 <= fVar3) && (fVar5 = fVar3, fVar1 + fVar2 <= fVar3)) {
      fVar5 = fVar1 + fVar2;
    }
  }
  else if ((fVar4 <= fVar1) && (fVar5 = fVar4, fVar4 <= fVar1 + fVar2)) {
    fVar5 = fVar1 + fVar2;
  }
  (this->m_Vel).field_1.y = fVar5;
  return;
}

Assistant:

void CCharacterCore::AddDragVelocity()
{
	// Apply hook interaction velocity
	float DragSpeed = m_pWorld->m_Tuning.m_HookDragSpeed;

	m_Vel.x = SaturatedAdd(-DragSpeed, DragSpeed, m_Vel.x, m_HookDragVel.x);
	m_Vel.y = SaturatedAdd(-DragSpeed, DragSpeed, m_Vel.y, m_HookDragVel.y);
}